

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int moveToRightmost(BtCursor *pCur)

{
  undefined2 uVar1;
  uint uVar2;
  MemPage *pMVar3;
  int rc;
  int iVar4;
  
  do {
    pMVar3 = pCur->pPage;
    if (pMVar3->leaf != '\0') {
      uVar1 = pMVar3->nCell;
      pCur->ix = uVar1 - 1;
      return 0;
    }
    uVar2 = *(uint *)(pMVar3->aData + (ulong)pMVar3->hdrOffset + 8);
    pCur->ix = pMVar3->nCell;
    iVar4 = moveToChild(pCur,uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                             uVar2 << 0x18);
  } while (iVar4 == 0);
  return iVar4;
}

Assistant:

static int moveToRightmost(BtCursor *pCur){
  Pgno pgno;
  int rc = SQLITE_OK;
  MemPage *pPage = 0;

  assert( cursorOwnsBtShared(pCur) );
  assert( pCur->eState==CURSOR_VALID );
  while( !(pPage = pCur->pPage)->leaf ){
    pgno = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    pCur->ix = pPage->nCell;
    rc = moveToChild(pCur, pgno);
    if( rc ) return rc;
  }
  pCur->ix = pPage->nCell-1;
  assert( pCur->info.nSize==0 );
  assert( (pCur->curFlags & BTCF_ValidNKey)==0 );
  return SQLITE_OK;
}